

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

StringBuilder * __thiscall Potassco::StringBuilder::append(StringBuilder *this,char *str,size_t n)

{
  ulong __n;
  Buffer buf;
  Buffer local_40;
  
  if (((this->field_0).sbo_[0x3f] & 0xc0U) == 0x40) {
    std::__cxx11::string::append((this->field_0).buf_.head,(ulong)str);
  }
  else {
    grow(&local_40,this,n);
    __n = local_40.size - local_40.used;
    if (n <= local_40.size - local_40.used) {
      __n = n;
    }
    memcpy(local_40.head + local_40.used,str,__n);
    (local_40.head + local_40.used)[__n] = '\0';
  }
  return this;
}

Assistant:

StringBuilder& StringBuilder::append(const char* str, std::size_t n) {
	if (type() == Str) {
		str_->append(str, n);
	}
	else {
		Buffer buf = grow(n);
		std::memcpy(buf.pos(), str, n = std::min(n, buf.free()));
		buf.pos()[n] = 0;
	}
	return *this;
}